

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O0

cTValue * lj_ctype_meta(CTState *cts,CTypeID id,MMS mm)

{
  bool bVar1;
  cTValue *local_90;
  cTValue *tv;
  CType *ct;
  MMS mm_local;
  CTypeID id_local;
  CTState *cts_local;
  
  tv = (cTValue *)(cts->tab + id);
  ct._4_4_ = id;
  while( true ) {
    bVar1 = true;
    if ((tv->u32).lo >> 0x1c != 8) {
      bVar1 = ((tv->u32).lo & 0xf0800000) == 0x20800000;
    }
    if (!bVar1) break;
    ct._4_4_ = (tv->u32).lo & 0xffff;
    tv = (cTValue *)(cts->tab + ct._4_4_);
  }
  if (((tv->u32).lo >> 0x1c == 2) && (cts->tab[(tv->u32).lo & 0xffff].info >> 0x1c == 6)) {
    local_90 = lj_tab_getstr(cts->miscmap,&cts->g->strempty);
  }
  else {
    local_90 = lj_tab_getinth(cts->miscmap,-ct._4_4_);
  }
  if ((((local_90 == (cTValue *)0x0) || ((int)(local_90->field_4).it >> 0xf != -0xc)) ||
      (cts_local = (CTState *)
                   lj_tab_getstr((GCtab *)(local_90->u64 & 0x7fffffffffff),
                                 (GCstr *)cts->g->gcroot[mm].gcptr64),
      (cTValue *)cts_local == (cTValue *)0x0)) || (*(uint64_t *)cts_local == 0xffffffffffffffff)) {
    cts_local = (CTState *)0x0;
  }
  return (cTValue *)cts_local;
}

Assistant:

cTValue *lj_ctype_meta(CTState *cts, CTypeID id, MMS mm)
{
  CType *ct = ctype_get(cts, id);
  cTValue *tv;
  while (ctype_isattrib(ct->info) || ctype_isref(ct->info)) {
    id = ctype_cid(ct->info);
    ct = ctype_get(cts, id);
  }
  if (ctype_isptr(ct->info) &&
      ctype_isfunc(ctype_get(cts, ctype_cid(ct->info))->info))
    tv = lj_tab_getstr(cts->miscmap, &cts->g->strempty);
  else
    tv = lj_tab_getinth(cts->miscmap, -(int32_t)id);
  if (tv && tvistab(tv) &&
      (tv = lj_tab_getstr(tabV(tv), mmname_str(cts->g, mm))) && !tvisnil(tv))
    return tv;
  return NULL;
}